

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

string * __thiscall
Diligent::GetContextObjectName_abi_cxx11_
          (string *__return_storage_ptr__,Diligent *this,char *Object,bool bIsDeferred,
          Uint32 ContextId)

{
  size_t sVar1;
  string *psVar2;
  stringstream ss;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (this == (Diligent *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)this,sVar1);
  }
  if ((char)Object == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," of immediate context",0x15);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," of deferred context #",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  psVar2 = (string *)std::ios_base::~ios_base(local_130);
  return psVar2;
}

Assistant:

static std::string GetContextObjectName(const char* Object, bool bIsDeferred, Uint32 ContextId)
{
    std::stringstream ss;
    ss << Object;
    if (bIsDeferred)
        ss << " of deferred context #" << ContextId;
    else
        ss << " of immediate context";
    return ss.str();
}